

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_16_tos_al(void)

{
  uint uVar1;
  uint uVar2;
  
  if (m68ki_cpu.s_flag == 0) {
    m68ki_exception_privilege_violation();
    return;
  }
  uVar1 = OPER_AL_16();
  uVar2 = uVar1 & m68ki_cpu.sr_mask;
  m68ki_cpu.t1_flag = uVar2 & 0x8000;
  m68ki_cpu.t0_flag = uVar2 & 0x4000;
  m68ki_cpu.int_mask = uVar2 & 0x700;
  m68ki_cpu.x_flag = uVar2 << 4 & 0x100;
  m68ki_cpu.n_flag = uVar2 << 4 & 0x80;
  m68ki_cpu.not_z_flag = (uint)((uVar2 & 4) == 0);
  m68ki_cpu.v_flag = (uVar2 & 2) << 6;
  m68ki_cpu.c_flag = (uVar2 & 1) << 8;
  m68ki_cpu.sp[m68ki_cpu.s_flag >> 1 & m68ki_cpu.m_flag | m68ki_cpu.s_flag] = m68ki_cpu.dar[0xf];
  m68ki_cpu.s_flag = uVar2 >> 0xb & 4;
  m68ki_cpu.m_flag = uVar2 >> 0xb & 2;
  m68ki_cpu.dar[0xf] = m68ki_cpu.sp[uVar2 >> 0xc & m68ki_cpu.m_flag | m68ki_cpu.s_flag];
  if (m68ki_cpu.nmi_pending == 0) {
    if (m68ki_cpu.int_level <= m68ki_cpu.int_mask) {
      return;
    }
    uVar1 = m68ki_cpu.int_level >> 8;
  }
  else {
    m68ki_cpu.nmi_pending = 0;
    uVar1 = 7;
  }
  m68ki_exception_interrupt(uVar1);
  return;
}

Assistant:

static void m68k_op_move_16_tos_al(void)
{
	if(FLAG_S)
	{
		uint new_sr = OPER_AL_16();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_set_sr(new_sr);
		return;
	}
	m68ki_exception_privilege_violation();
}